

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall Js::LocalObjectAddressForSlot::IsInDeadZone(LocalObjectAddressForSlot *this)

{
  bool bVar1;
  uint uVar2;
  Var aValue;
  RecyclableObject *pRVar3;
  
  aValue = ScopeSlots::Get(&this->slotArray,this->slotIndex);
  bVar1 = VarIs<Js::RecyclableObject>(aValue);
  uVar2 = 0;
  if (bVar1) {
    pRVar3 = VarTo<Js::RecyclableObject>(aValue);
    uVar2 = (uint)(&((((((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->
                         super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                      javascriptLibrary)->undeclBlockVarSentinel).ptr)->super_RecyclableObject ==
                  pRVar3);
  }
  return uVar2;
}

Assistant:

BOOL LocalObjectAddressForSlot::IsInDeadZone() const
    {
        Var value = slotArray.Get(slotIndex);
        if (!VarIs<RecyclableObject>(value))
        {
            return FALSE;
        }

        RecyclableObject* obj = VarTo<RecyclableObject>(value);
        ScriptContext* scriptContext = obj->GetScriptContext();
        return scriptContext->IsUndeclBlockVar(obj) ? TRUE : FALSE;
    }